

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

void __thiscall icu_63::TZEnumeration::TZEnumeration(TZEnumeration *this,TZEnumeration *other)

{
  int iVar1;
  int32_t iVar2;
  int32_t *__dest;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__TZEnumeration_003e38f0;
  this->map = (int32_t *)0x0;
  this->localMap = (int32_t *)0x0;
  this->len = 0;
  this->pos = 0;
  if (other->localMap == (int32_t *)0x0) {
    this->map = other->map;
    this->localMap = (int32_t *)0x0;
    iVar2 = other->pos;
    this->len = other->len;
    this->pos = iVar2;
  }
  else {
    __dest = (int32_t *)uprv_malloc_63((long)other->len << 2);
    this->localMap = __dest;
    if (__dest == (int32_t *)0x0) {
      this->len = 0;
      this->pos = 0;
      this->map = (int32_t *)0x0;
    }
    else {
      iVar1 = other->len;
      this->len = iVar1;
      memcpy(__dest,other->localMap,(long)iVar1 << 2);
      this->pos = other->pos;
      this->map = __dest;
    }
  }
  return;
}

Assistant:

TZEnumeration(const TZEnumeration &other) : StringEnumeration(), map(NULL), localMap(NULL), len(0), pos(0) {
        if (other.localMap != NULL) {
            localMap = (int32_t *)uprv_malloc(other.len * sizeof(int32_t));
            if (localMap != NULL) {
                len = other.len;
                uprv_memcpy(localMap, other.localMap, len * sizeof(int32_t));
                pos = other.pos;
                map = localMap;
            } else {
                len = 0;
                pos = 0;
                map = NULL;
            }
        } else {
            map = other.map;
            localMap = NULL;
            len = other.len;
            pos = other.pos;
        }
    }